

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall chrono::ChSystem::SetCollisionSystemType(ChSystem *this,ChCollisionSystemType type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  ChCollisionSystemBullet *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ChLog *pCVar4;
  undefined1 local_29;
  ChCollisionSystemBullet *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if ((this->assembly).nbodies == 0) {
    this->collision_system_type = type;
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar4->super_ChStreamOutAscii,
               "Chrono was not built with Thrust support. CHRONO collision system type not available.\n"
              );
    this->collision_system_type = BULLET;
    if (type != CHRONO) {
      if (type == BULLET) {
        local_28 = (ChCollisionSystemBullet *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::collision::ChCollisionSystemBullet,std::allocator<chrono::collision::ChCollisionSystemBullet>>
                  (&_Stack_20,&local_28,
                   (allocator<chrono::collision::ChCollisionSystemBullet> *)&local_29);
        _Var3._M_pi = _Stack_20._M_pi;
        pCVar2 = local_28;
        local_28 = (ChCollisionSystemBullet *)0x0;
        _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (this->collision_system).
                  super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (this->collision_system).
        super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = &pCVar2->super_ChCollisionSystem;
        (this->collision_system).
        super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var3._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
          }
        }
      }
      else {
        pCVar4 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar4->super_ChStreamOutAscii,
                   "Collision system type not supported. Use SetCollisionSystem instead.\n");
      }
    }
    peVar1 = (this->collision_system).
             super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar1->_vptr_ChCollisionSystem[0xd])(peVar1,(ulong)(uint)this->nthreads_collision);
    ((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_system = this;
    return;
  }
  __assert_fail("assembly.GetNbodies() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChSystem.cpp"
                ,0x159,
                "virtual void chrono::ChSystem::SetCollisionSystemType(ChCollisionSystemType)");
}

Assistant:

void ChSystem::SetCollisionSystemType(ChCollisionSystemType type) {
    assert(assembly.GetNbodies() == 0);

    collision_system_type = type;

#ifndef CHRONO_COLLISION
    GetLog() << "Chrono was not built with Thrust support. CHRONO collision system type not available.\n";
    collision_system_type = ChCollisionSystemType::BULLET;
#endif

    switch (type) {
        case ChCollisionSystemType::BULLET:
            collision_system = chrono_types::make_shared<ChCollisionSystemBullet>();
            break;
        case ChCollisionSystemType::CHRONO:
#ifdef CHRONO_COLLISION
            collision_system = chrono_types::make_shared<ChCollisionSystemChrono>();
#endif
            break;
        default:
            GetLog() << "Collision system type not supported. Use SetCollisionSystem instead.\n";
            break;
    }

    collision_system->SetNumThreads(nthreads_collision);
    collision_system->SetSystem(this);
}